

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompression.hpp
# Opt level: O1

void __thiscall
duckdb::CompressedStringScanState::~CompressedStringScanState(CompressedStringScanState *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_StringScanState).super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__CompressedStringScanState_019ab2d0;
  p_Var1 = (this->dictionary).internal.
           super___shared_ptr<duckdb::Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->sel_vec).internal.
           super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  BufferHandle::~BufferHandle(&this->owned_handle);
  (this->super_StringScanState).super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__StringScanState_019ab320;
  BufferHandle::~BufferHandle(&(this->super_StringScanState).handle);
  operator_delete(this);
  return;
}

Assistant:

explicit CompressedStringScanState(BufferHandle &&handle_p)
	    : StringScanState(), owned_handle(std::move(handle_p)), handle(owned_handle) {
	}